

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

bool __thiscall
SuffixTree::GeneralizedSuffixTree::AddSymbol(GeneralizedSuffixTree *this,char symbol)

{
  reference pvVar1;
  char *pcVar2;
  size_type sVar3;
  key_type local_2c;
  mapped_type *local_28;
  Edge *edge;
  GeneralizedSuffixTree *pGStack_18;
  char symbol_local;
  GeneralizedSuffixTree *this_local;
  
  if (symbol == '\0') {
    this_local._7_1_ = false;
  }
  else {
    edge._7_1_ = symbol;
    pGStack_18 = this;
    if (this->active_length == 0) {
      local_2c = (key_type)symbol;
      sVar3 = std::
              unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
              ::count(&this->active_node->edges,&local_2c);
      if (sVar3 == 0) {
        this_local._7_1_ = false;
      }
      else {
        this->active_edge = (int)edge._7_1_;
        IncActiveLength(this);
        this_local._7_1_ = true;
      }
    }
    else {
      local_28 = std::
                 unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                 ::operator[](&this->active_node->edges,&this->active_edge);
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)local_28->string_number);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1);
      if (*pcVar2 == edge._7_1_) {
        IncActiveLength(this);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GeneralizedSuffixTree::AddSymbol (char symbol)
{
    if (!symbol)
        return false;
    if (active_length)
    {
        // active point is on edge
        Edge &edge = active_node->edges[active_edge];
        if (strings[edge.string_number][edge.start + active_length] == symbol)
        {
            IncActiveLength();
            return true;
        }
        else
            return false;
    }
    else
    {
        // active point is on node
        if (active_node->edges.count (static_cast<uint> (symbol)))
        {
            active_edge = static_cast<uint> (symbol);
            IncActiveLength();
            return true;
        }
        else
            return false;
    }
}